

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

FBaseCVar ** __thiscall
TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::Insert
          (TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_> *this,FName *key
          ,FBaseCVar **value)

{
  Node *pNVar1;
  Node *pNVar2;
  FName local_c;
  
  local_c = (FName)key->Index;
  pNVar1 = this->Nodes + (this->Size - 1 & local_c.Index);
  while ((pNVar2 = pNVar1, pNVar2 != (Node *)0x0 && (pNVar2->Next != (Node *)0x1))) {
    pNVar1 = pNVar2->Next;
    if ((pNVar2->Pair).Key.Index == local_c.Index) {
LAB_00372376:
      if (pNVar2 == (Node *)0x0) {
        pNVar2 = NewKey(this,&local_c);
      }
      (pNVar2->Pair).Value = *value;
      return &(pNVar2->Pair).Value;
    }
  }
  pNVar2 = (Node *)0x0;
  goto LAB_00372376;
}

Assistant:

VT &Insert(const KT key, const VT &value)
	{
		Node *n = FindKey(key);
		if (n != NULL)
		{
			n->Pair.Value = value;
		}
		else
		{
			n = NewKey(key);
			::new(&n->Pair.Value) VT(value);
		}
		return n->Pair.Value;
	}